

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O3

sU32 ryg_dxt::MatchColorsBlock(Pixel *block,Pixel *color,sBool dither)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  sInt i_2;
  int iVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  sInt i;
  int iVar14;
  long lVar15;
  int iVar16;
  sInt *psVar17;
  bool bVar18;
  int local_b8 [8];
  int aiStack_98 [10];
  sInt stops [4];
  int aiStack_58 [2];
  sInt dots [16];
  
  iVar7 = (uint)(color->field_0).r - (uint)*(byte *)((long)color + 6);
  iVar9 = (uint)(color->field_0).g - (uint)*(byte *)((long)color + 5);
  iVar13 = (uint)(color->field_0).b - (uint)color[1].field_0.b;
  lVar15 = 0;
  do {
    aiStack_98[lVar15] =
         (uint)block[lVar15].field_0.b * iVar13 +
         (uint)*(byte *)((long)block + lVar15 * 4 + 1) * iVar9 +
         (uint)*(byte *)((long)block + lVar15 * 4 + 2) * iVar7;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  lVar15 = 0;
  do {
    local_b8[lVar15] =
         (uint)color[lVar15].field_0.b * iVar13 +
         (uint)*(byte *)((long)color + lVar15 * 4 + 1) * iVar9 +
         (uint)*(byte *)((long)color + lVar15 * 4 + 2) * iVar7;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  iVar7 = local_b8[1] + local_b8[3] >> 1;
  iVar9 = local_b8[3] + local_b8[2] >> 1;
  iVar13 = local_b8[2] + local_b8[0] >> 1;
  if (dither) {
    iVar9 = iVar9 * 0x10;
    dots[2] = 0;
    dots[3] = 0;
    dots[4] = 0;
    dots[5] = 0;
    aiStack_58[0] = 0;
    aiStack_58[1] = 0;
    dots[0] = 0;
    dots[1] = 0;
    iVar7 = iVar7 << 4;
    iVar13 = iVar13 * 0x10;
    lVar15 = 0;
    iVar16 = 0;
    uVar8 = 0;
    piVar6 = aiStack_58;
    psVar17 = dots + 2;
    iVar11 = 0;
    do {
      piVar10 = piVar6;
      iVar14 = *(int *)((long)aiStack_98 + lVar15 * 2);
      iVar16 = iVar11 * 5 + iVar16 * 3 + iVar14 * 0x10;
      uVar2 = (uint)(iVar7 <= iVar16) * 2 + 1;
      if (iVar9 <= iVar16) {
        uVar2 = (uint)(iVar16 < iVar13) * 2;
      }
      iVar14 = iVar14 - local_b8[uVar2];
      *piVar10 = iVar14;
      iVar16 = *(int *)((long)aiStack_98 + lVar15 * 2 + 4);
      iVar12 = psVar17[1];
      iVar11 = iVar16 * 0x10 + iVar11 + psVar17[2] * 3 + iVar12 * 5 + iVar14 * 7;
      uVar3 = (uint)(iVar7 <= iVar11) * 2 + 1;
      if (iVar9 <= iVar11) {
        uVar3 = (uint)(iVar11 < iVar13) * 2;
      }
      iVar16 = iVar16 - local_b8[uVar3];
      piVar10[1] = iVar16;
      iVar11 = *(int *)((long)aiStack_98 + lVar15 * 2 + 8);
      iVar1 = psVar17[2];
      iVar12 = iVar11 * 0x10 + iVar12 + psVar17[3] * 3 + iVar1 * 5 + iVar16 * 7;
      uVar4 = (uint)(iVar7 <= iVar12) * 2 + 1;
      if (iVar9 <= iVar12) {
        uVar4 = (uint)(iVar12 < iVar13) * 2;
      }
      iVar11 = iVar11 - local_b8[uVar4];
      piVar10[2] = iVar11;
      iVar12 = *(int *)((long)aiStack_98 + lVar15 * 2 + 0xc);
      iVar11 = iVar12 * 0x10 + iVar1 + psVar17[3] * 5 + iVar11 * 7;
      uVar5 = (uint)(iVar7 <= iVar11) * 2 + 1;
      if (iVar9 <= iVar11) {
        uVar5 = (uint)(iVar11 < iVar13) * 2;
      }
      piVar10[3] = iVar12 - local_b8[uVar5];
      uVar8 = uVar8 | (uVar5 << 6 | uVar4 * 0x10 + uVar3 * 4) + uVar2 << ((byte)lVar15 & 0x1f);
      lVar15 = lVar15 + 8;
      piVar6 = psVar17;
      psVar17 = piVar10;
      iVar11 = iVar14;
    } while ((int)lVar15 != 0x20);
  }
  else {
    uVar8 = 0;
    lVar15 = 0xf;
    do {
      iVar16 = aiStack_98[lVar15];
      iVar11 = (iVar7 <= iVar16) + 1 + (uint)(iVar7 <= iVar16);
      if (iVar9 <= iVar16) {
        iVar11 = (uint)(iVar16 < iVar13) * 2;
      }
      uVar8 = iVar11 + uVar8 * 4;
      bVar18 = lVar15 != 0;
      lVar15 = lVar15 + -1;
    } while (bVar18);
  }
  return uVar8;
}

Assistant:

static sU32 MatchColorsBlock(const Pixel* block, const Pixel* color, sBool dither) {
  sU32 mask = 0;
  sInt dirr = color[0].r - color[1].r;
  sInt dirg = color[0].g - color[1].g;
  sInt dirb = color[0].b - color[1].b;

  sInt dots[16];
  for (sInt i = 0; i < 16; i++)
    dots[i] = block[i].r * dirr + block[i].g * dirg + block[i].b * dirb;

  sInt stops[4];
  for (sInt i = 0; i < 4; i++)
    stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;

  sInt c0Point = (stops[1] + stops[3]) >> 1;
  sInt halfPoint = (stops[3] + stops[2]) >> 1;
  sInt c3Point = (stops[2] + stops[0]) >> 1;

  if (!dither) {
    // the version without dithering is straightforward
    for (sInt i = 15; i >= 0; i--) {
      mask <<= 2;
      sInt dot = dots[i];

      if (dot < halfPoint)
        mask |= (dot < c0Point) ? 1 : 3;
      else
        mask |= (dot < c3Point) ? 2 : 0;
    }
  } else {
    // with floyd-steinberg dithering (see above)
    sInt err[8], *ep1 = err, *ep2 = err + 4;
    sInt* dp = dots;

    c0Point <<= 4;
    halfPoint <<= 4;
    c3Point <<= 4;
    for (sInt i = 0; i < 8; i++)
      err[i] = 0;

    for (sInt y = 0; y < 4; y++) {
      sInt dot, lmask, step;

      // pixel 0
      dot = (dp[0] << 4) + (3 * ep2[1] + 5 * ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[0] = dp[0] - stops[step];
      lmask = step;

      // pixel 1
      dot = (dp[1] << 4) + (7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[1] = dp[1] - stops[step];
      lmask |= step << 2;

      // pixel 2
      dot = (dp[2] << 4) + (7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[2] = dp[2] - stops[step];
      lmask |= step << 4;

      // pixel 3
      dot = (dp[3] << 4) + (7 * ep1[2] + 5 * ep2[3] + ep2[2]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[3] = dp[3] - stops[step];
      lmask |= step << 6;

      // advance to next line
      sSwap(ep1, ep2);
      dp += 4;
      mask |= lmask << (y * 8);
    }
  }

  return mask;
}